

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitCall(ParseNodeCall *pnodeCall,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
             BOOL fReturnValue,BOOL fEvaluateComponents,RegSlot overrideThisLocation,
             RegSlot newTargetLocation)

{
  code *pcVar1;
  ProfileId PVar2;
  bool bVar3;
  ProfileId PVar4;
  undefined4 *puVar5;
  RegSlot local_ac;
  bool local_91;
  bool local_89;
  AuxArray<unsigned_int> *local_88;
  AuxArray<unsigned_int> *spreadIndices;
  bool local_77;
  bool emitArgOutsAtEnd;
  bool emitProfiledArgouts;
  ProfileId callSiteId;
  ProfileId callApplyCallSiteId;
  bool releaseThisLocation;
  uint uStack_70;
  ArgSlot argSlotCount;
  BOOL fIsEval;
  uint argCount;
  uint16 spreadArgCount;
  ParseNode *pnodeArgs;
  ParseNode *pnodeTarget;
  BOOL fIsSuperCall;
  BOOL fSideEffectArgs;
  BOOL fHasNewTarget;
  RegSlot callObjLocation;
  RegSlot thisLocation;
  RegSlot overrideThisLocation_local;
  BOOL fEvaluateComponents_local;
  BOOL fReturnValue_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeCall *pnodeCall_local;
  
  fHasNewTarget = -1;
  fSideEffectArgs = -1;
  fIsSuperCall = (BOOL)(newTargetLocation != 0xffffffff);
  pnodeTarget._4_4_ = 0;
  pnodeTarget._0_4_ = (uint)((byte)pnodeCall->field_0x24 >> 3 & 1);
  pnodeArgs = pnodeCall->pnodeTarget;
  _argCount = pnodeCall->pnodeArgs;
  fIsEval._2_2_ = pnodeCall->spreadArgCount;
  callObjLocation = overrideThisLocation;
  thisLocation = fEvaluateComponents;
  overrideThisLocation_local = fReturnValue;
  _fEvaluateComponents_local = funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)pnodeCall;
  bVar3 = CreateNativeArrays(byteCodeGenerator,funcInfo);
  if (bVar3) {
    CallTargetIsArray(pnodeArgs);
  }
  uStack_70 = CountArguments(_argCount,(BOOL *)((long)&pnodeTarget + 4));
  _callSiteId = (uint)(*(byte *)((long)&byteCodeGenerator_local->currentBlock + 4) >> 2 & 1);
  _emitArgOutsAtEnd = (ushort)uStack_70;
  if (_callSiteId == 0) {
    if (fIsSuperCall != 0) {
      uStack_70 = uStack_70 + 1;
    }
  }
  else {
    if (fIsSuperCall != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x214d,"(!fHasNewTarget)","!fHasNewTarget");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if (1 < uStack_70) {
      uStack_70 = uStack_70 + 1;
    }
  }
  if (_emitArgOutsAtEnd <= uStack_70) {
    if (overrideThisLocation_local != 0) {
      *(byte *)((long)&byteCodeGenerator_local->scriptContext + 1) =
           *(byte *)((long)&byteCodeGenerator_local->scriptContext + 1) & 0xfe | 1;
    }
    local_77 = true;
    spreadIndices._6_2_ = -1;
    if ((uint)pnodeTarget == 0) {
      if (thisLocation == 0) {
        EmitCallTargetNoEvalComponents
                  (pnodeArgs,pnodeTarget._4_4_,(RegSlot *)&fHasNewTarget,&local_77,
                   (RegSlot *)&fSideEffectArgs,(ByteCodeGenerator *)funcInfo_local,
                   _fEvaluateComponents_local);
      }
      else {
        EmitCallTarget(pnodeArgs,pnodeTarget._4_4_,(RegSlot *)&fHasNewTarget,&local_77,
                       (RegSlot *)&fSideEffectArgs,(ByteCodeGenerator *)funcInfo_local,
                       _fEvaluateComponents_local,(ProfileId *)((long)&spreadIndices + 6));
      }
    }
    if (callObjLocation != 0xffffffff) {
      fHasNewTarget = callObjLocation;
      local_77 = false;
    }
    FuncInfo::StartRecordingOutArgs(_fEvaluateComponents_local,uStack_70);
    spreadIndices._4_2_ =
         ByteCodeGenerator::GetNextCallSiteId((ByteCodeGenerator *)funcInfo_local,CallI);
    if (spreadIndices._6_2_ != -1) {
      JsUtil::
      BaseDictionary<unsigned_short,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::AddNew(_fEvaluateComponents_local->callSiteToCallApplyCallSiteMap,
               (unsigned_short *)((long)&spreadIndices + 4),
               (unsigned_short *)((long)&spreadIndices + 6));
    }
    PVar2 = spreadIndices._4_2_;
    PVar4 = ByteCodeGenerator::GetCurrentCallSiteId((ByteCodeGenerator *)funcInfo_local);
    spreadIndices._3_1_ = PVar2 != PVar4;
    local_89 = true;
    if ((*(byte *)((long)&byteCodeGenerator_local->currentBlock + 4) >> 4 & 1) == 0) {
      bVar3 = Js::FunctionProxy::IsCoroutine
                        (&_fEvaluateComponents_local->byteCodeFunction->super_FunctionProxy);
      local_91 = false;
      if (bVar3) {
        local_91 = byteCodeGenerator_local->funcInfoStack !=
                   (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      }
      local_89 = local_91;
    }
    spreadIndices._2_1_ = local_89;
    EmitArgList(_argCount,fHasNewTarget,newTargetLocation,_callSiteId,thisLocation,
                (ByteCodeGenerator *)funcInfo_local,_fEvaluateComponents_local,spreadIndices._4_2_,
                (ArgSlot)uStack_70,local_89,(bool)(spreadIndices._3_1_ & 1),fIsEval._2_2_,&local_88)
    ;
    if (thisLocation == 0) {
      EmitCallInstrNoEvalComponents
                ((ParseNodeCall *)byteCodeGenerator_local,_callSiteId,fIsSuperCall,fHasNewTarget,
                 fSideEffectArgs,(uint)_emitArgOutsAtEnd,(ByteCodeGenerator *)funcInfo_local,
                 _fEvaluateComponents_local,spreadIndices._4_2_,local_88);
    }
    else {
      if ((local_77 & 1U) == 0) {
        local_ac = 0xffffffff;
      }
      else {
        local_ac = fHasNewTarget;
      }
      EmitCallInstr((ParseNodeCall *)byteCodeGenerator_local,_callSiteId,fIsSuperCall,local_ac,
                    fSideEffectArgs,(uint)_emitArgOutsAtEnd,(ByteCodeGenerator *)funcInfo_local,
                    _fEvaluateComponents_local,spreadIndices._4_2_,local_88);
    }
    FuncInfo::EndRecordingOutArgs(_fEvaluateComponents_local,(ArgSlot)uStack_70);
    return;
  }
  Js::Throw::OutOfMemory();
}

Assistant:

void EmitCall(
    ParseNodeCall * pnodeCall,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    BOOL fReturnValue,
    BOOL fEvaluateComponents,
    Js::RegSlot overrideThisLocation,
    Js::RegSlot newTargetLocation)
{
    // If the call returns a float, we'll note this in the byte code.
    Js::RegSlot thisLocation = Js::Constants::NoRegister;
    Js::RegSlot callObjLocation = Js::Constants::NoRegister;
    BOOL fHasNewTarget = newTargetLocation != Js::Constants::NoRegister;
    BOOL fSideEffectArgs = FALSE;
    BOOL fIsSuperCall = pnodeCall->isSuperCall;
    ParseNode *pnodeTarget = pnodeCall->pnodeTarget;
    ParseNode *pnodeArgs = pnodeCall->pnodeArgs;
    uint16 spreadArgCount = pnodeCall->spreadArgCount;

    if (CreateNativeArrays(byteCodeGenerator, funcInfo) && CallTargetIsArray(pnodeTarget)) {
        // some minifiers (potentially incorrectly) assume that "v = new Array()" and "v = Array()" are equivalent,
        // and replace the former with the latter to save 4 characters. What that means for us is that it, at least
        // initially, uses the "Call" path. We want to guess that it _is_ just "new Array()" and change over to the
        // "new" path, since then our native array handling can kick in.
        /*EmitNew(pnode, byteCodeGenerator, funcInfo);
        return;*/
    }

    unsigned int argCount = CountArguments(pnodeArgs, &fSideEffectArgs);

    BOOL fIsEval = pnodeCall->isEvalCall;
    Js::ArgSlot argSlotCount = (Js::ArgSlot)argCount;

    if (fIsEval)
    {
        Assert(!fHasNewTarget);

        //
        // "eval" takes the closure environment as an extra argument
        // Pass the closure env only if some argument is passed
        // For just eval(), don't pass the closure environment
        //
        if (argCount > 1)
        {
            argCount++;
        }
    }
    else if (fHasNewTarget)
    {
        // When we need to pass new.target explicitly, it is passed as an extra argument.
        // This is similar to how eval passes an extra argument for the frame display and is
        // used to support cases where we need to pass both 'this' and new.target as part of
        // a function call.
        // OpCode::LdNewTarget knows how to look at the call flags and fetch this argument.
        argCount++;
    }

    // argCount indicates the total arguments count including the extra arguments.
    // argSlotCount indicates the actual arguments count. So argCount should always never be les sthan argSlotCount.
    if (argCount < (unsigned int)argSlotCount)
    {
        Js::Throw::OutOfMemory();
    }

    if (fReturnValue)
    {
        pnodeCall->isUsed = true;
    }

    //
    // Set up the call.
    //

    bool releaseThisLocation = true;

    // We already emit the call target for super calls in EmitSuperCall
    Js::ProfileId callApplyCallSiteId = Js::Constants::NoProfileId;
    if (!fIsSuperCall)
    {
        if (!fEvaluateComponents)
        {
            EmitCallTargetNoEvalComponents(pnodeTarget, fSideEffectArgs, &thisLocation, &releaseThisLocation, &callObjLocation, byteCodeGenerator, funcInfo);
        }
        else
        {
            EmitCallTarget(pnodeTarget, fSideEffectArgs, &thisLocation, &releaseThisLocation, &callObjLocation, byteCodeGenerator, funcInfo, &callApplyCallSiteId);
        }
    }

    // If we are strictly overriding the this location, ignore what the call target set this location to.
    if (overrideThisLocation != Js::Constants::NoRegister)
    {
        thisLocation = overrideThisLocation;
        releaseThisLocation = false;
    }

    // Evaluate the arguments (nothing mode-specific here).
    // Start call, allocate out param space
    // We have to use the arguments count including the extra args to Start Call as we use it to allocated space for all the args
    funcInfo->StartRecordingOutArgs(argCount);

    Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);
    if (callApplyCallSiteId != Js::Constants::NoProfileId)
    {
        funcInfo->callSiteToCallApplyCallSiteMap->AddNew(callSiteId, callApplyCallSiteId);
    }

    // Only emit profiled argouts if we're going to allocate callSiteInfo (on the DynamicProfileInfo) for this call.
    bool emitProfiledArgouts = callSiteId != byteCodeGenerator->GetCurrentCallSiteId();

    // Emit argouts at end for generators so that we don't need to restore them when bailing in
    bool emitArgOutsAtEnd = pnodeCall->hasDestructuring || (funcInfo->byteCodeFunction->IsCoroutine() && pnodeCall->pnodeArgs != nullptr);
    Js::AuxArray<uint32> *spreadIndices;
    EmitArgList(pnodeArgs, thisLocation, newTargetLocation, fIsEval, fEvaluateComponents, byteCodeGenerator, funcInfo, callSiteId, (Js::ArgSlot)argCount, emitArgOutsAtEnd, emitProfiledArgouts, spreadArgCount, &spreadIndices);

    if (!fEvaluateComponents)
    {
        EmitCallInstrNoEvalComponents(pnodeCall, fIsEval, fHasNewTarget, thisLocation, callObjLocation, argSlotCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
    }
    else
    {
        EmitCallInstr(pnodeCall, fIsEval, fHasNewTarget, releaseThisLocation ? thisLocation : Js::Constants::NoRegister, callObjLocation, argSlotCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
    }

    // End call, pop param space
    funcInfo->EndRecordingOutArgs((Js::ArgSlot)argCount);
}